

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::entry_point_args_classic_abi_cxx11_(CompilerMSL *this,bool append_comma)

{
  ulong uVar1;
  byte in_DL;
  undefined7 in_register_00000031;
  bool append_comma_local;
  CompilerMSL *this_local;
  string *ep_args;
  
  entry_point_arg_stage_in_abi_cxx11_(this);
  entry_point_args_discrete_descriptors
            ((CompilerMSL *)CONCAT71(in_register_00000031,append_comma),(string *)this);
  entry_point_args_builtin
            ((CompilerMSL *)CONCAT71(in_register_00000031,append_comma),(string *)this);
  uVar1 = ::std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && ((in_DL & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
  }
  return this;
}

Assistant:

string CompilerMSL::entry_point_args_classic(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}